

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Boxed_Value
chaiscript::detail::Static_Caster<std::logic_error,_std::exception>::cast(Boxed_Value *t_from)

{
  bool bVar1;
  Type_Info *this;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  Boxed_Value BVar4;
  exception *data_1;
  logic_error *d_1;
  exception *data;
  logic_error *d;
  Type_Conversions_State *in_stack_fffffffffffffef8;
  Boxed_Value *in_stack_ffffffffffffff00;
  undefined1 uVar5;
  Type_Info *in_stack_ffffffffffffff08;
  Type_Info *in_stack_ffffffffffffff10;
  allocator *paVar6;
  allocator local_b9;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  type_info *in_stack_ffffffffffffff60;
  Type_Info *in_stack_ffffffffffffff68;
  bad_boxed_dynamic_cast *in_stack_ffffffffffffff70;
  
  this = Boxed_Value::get_type_info((Boxed_Value *)0x369ab1);
  user_type<std::logic_error>();
  bVar1 = Type_Info::bare_equal(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x48);
    Boxed_Value::get_type_info((Boxed_Value *)0x369cc7);
    paVar6 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Unknown dynamic_cast_conversion",paVar6);
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    __cxa_throw(uVar2,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_dynamic_cast::~bad_boxed_dynamic_cast);
  }
  bVar1 = Boxed_Value::is_pointer((Boxed_Value *)0x369aeb);
  if (bVar1) {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)0x369b01);
    if (bVar1) {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)this);
      Boxed_Value::Boxed_Value<std::shared_ptr<std::exception_const>,void>
                (in_stack_ffffffffffffff00,
                 (shared_ptr<const_std::exception> *)in_stack_fffffffffffffef8,false);
      std::shared_ptr<const_std::exception>::~shared_ptr
                ((shared_ptr<const_std::exception> *)0x369b51);
      _Var3._M_pi = extraout_RDX;
    }
    else {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)this);
      Boxed_Value::Boxed_Value<std::shared_ptr<std::exception>,void>
                (in_stack_ffffffffffffff00,(shared_ptr<std::exception> *)in_stack_fffffffffffffef8,
                 false);
      std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x369bc6);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    bVar1 = Boxed_Value::is_const((Boxed_Value *)0x369bfe);
    if (bVar1) {
      Cast_Helper<const_std::logic_error_&>::cast
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
      std::cref<std::exception>((exception *)in_stack_fffffffffffffef8);
      Boxed_Value::Boxed_Value<std::reference_wrapper<std::exception_const>,void>
                ((Boxed_Value *)in_stack_ffffffffffffff10,
                 (reference_wrapper<const_std::exception> *)in_stack_ffffffffffffff08,(bool)uVar5);
      _Var3._M_pi = extraout_RDX_01;
    }
    else {
      Cast_Helper<std::logic_error_&>::cast(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
      std::ref<std::exception>((exception *)in_stack_fffffffffffffef8);
      Boxed_Value::Boxed_Value<std::reference_wrapper<std::exception>,void>
                ((Boxed_Value *)in_stack_ffffffffffffff10,
                 (reference_wrapper<std::exception> *)in_stack_ffffffffffffff08,(bool)uVar5);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = static_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = static_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }